

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O1

bool __thiscall
SuperCardPro::SendCmd(SuperCardPro *this,uint8_t cmd,void *buf,int len,void *bulkbuf,int bulklen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  exception *this_00;
  ulong uVar4;
  char cVar5;
  uint8_t *puVar6;
  uint uVar7;
  int iVar8;
  uint8_t *p;
  int bytes_read;
  uint8_t result [2];
  Data data;
  int local_50;
  uint8_t local_4a;
  uint8_t local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (len < 1) {
    cVar5 = 'J';
  }
  else {
    cVar5 = 'J';
    uVar4 = 0;
    do {
      cVar5 = cVar5 + *(char *)((long)buf + uVar4);
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(long)(len + 3),(allocator_type *)&local_50);
  *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = cmd;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (uint8_t)len;
  if (len != 0) {
    memcpy(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 2,buf,(long)len);
  }
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[(long)len + 2] =
       cVar5 + *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start +
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  bVar2 = WriteExact(this,local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                     (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  if (bVar2) {
    if (cmd == 0xa9) {
      local_50 = 0;
      bVar2 = bulklen < 1;
      if (0 < bulklen) {
        do {
          iVar3 = (*this->_vptr_SuperCardPro[2])(this,bulkbuf,(ulong)(uint)bulklen,&local_50);
          if ((char)iVar3 == '\0') break;
          bulkbuf = (void *)((long)bulkbuf + (long)local_50);
          bVar2 = bulklen - local_50 < 1;
          uVar7 = bulklen - local_50;
          bVar1 = local_50 <= bulklen;
          bulklen = uVar7;
        } while (uVar7 != 0 && bVar1);
      }
      if (bVar2) goto LAB_001703ef;
    }
    else if ((cmd != 0xaa) || (bVar2 = WriteExact(this,bulkbuf,bulklen), bVar2)) {
LAB_001703ef:
      local_50 = 0;
      uVar4 = 2;
      puVar6 = &local_4a;
      bVar2 = false;
      do {
        iVar8 = (int)uVar4;
        iVar3 = (*this->_vptr_SuperCardPro[2])(this,puVar6,uVar4,&local_50);
        if ((char)iVar3 == '\0') break;
        puVar6 = puVar6 + local_50;
        bVar2 = iVar8 - local_50 < 1;
        uVar4 = (ulong)(uint)(iVar8 - local_50);
      } while (iVar8 - local_50 != 0 && local_50 <= iVar8);
      if (bVar2) {
        if (local_4a != cmd) {
          this_00 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[28]>
                    (this_00,(char (*) [28])"SCP result command mismatch");
          __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar2 = local_49 == 'O';
        this->m_error = local_49;
        goto LAB_00170457;
      }
    }
  }
  bVar2 = false;
LAB_00170457:
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool SuperCardPro::SendCmd(uint8_t cmd, void* buf, int len, void* bulkbuf, int bulklen)
{
    auto p = reinterpret_cast<uint8_t*>(buf);
    uint8_t datasum = CHECKSUM_INIT;
    for (auto i = 0; i < len; ++i)
        datasum += p[i];

    Data data(2 + len + 1);
    data[0] = cmd;
    data[1] = static_cast<uint8_t>(len);
    if (len) memcpy(&data[2], buf, len);
    data[2 + len] = data[0] + data[1] + datasum;

    if (!WriteExact(&data[0], data.size()))
        return false;

    if (cmd == CMD_LOADRAM_USB && !WriteExact(bulkbuf, bulklen))
        return false;
    else if (cmd == CMD_SENDRAM_USB && !ReadExact(bulkbuf, bulklen))
        return false;

    uint8_t result[2];
    if (!ReadExact(result, sizeof(result)))
        return false;

    if (result[0] != cmd)
        throw util::exception("SCP result command mismatch");

    if (result[1] != pr_Ok)
    {
        m_error = result[1];
        return false;
    }

    m_error = result[1];    // pr_Ok
    return true;
}